

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O1

void __thiscall lts2::LBDOperator::ApplyConjugate(LBDOperator *this,Mat *X,Mat *AstarX)

{
  _InputArray *p_Var1;
  long lVar2;
  Mat basisImage;
  _InputArray local_100;
  _InputArray local_e8;
  undefined8 uStack_d0;
  long local_c8;
  _OutputArray local_c0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  _InputArray local_98;
  undefined8 uStack_80;
  
  local_a0 = (this->_patchSize).width;
  local_9c = (this->_patchSize).height;
  cv::Mat::create(AstarX,&local_a0,5);
  local_e8.obj = &local_98;
  local_98.sz.width = 0;
  local_98.sz.height = 0;
  uStack_80 = 0;
  local_98.flags = 0;
  local_98._4_4_ = 0;
  local_98.obj = (void *)0x0;
  local_e8.flags = -0x3efdfffa;
  local_e8.sz.width = 1;
  local_e8.sz.height = 4;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)AstarX,&local_e8);
  local_a8 = (this->_patchSize).width;
  local_a4 = (this->_patchSize).height;
  local_e8.sz.width = 0;
  local_e8.sz.height = 0;
  uStack_d0 = 0;
  local_e8.flags = 0;
  local_e8._4_4_ = 0;
  local_e8.obj = (Mat *)0x0;
  cv::Mat::Mat((Mat *)&local_98,&local_a8,5,&local_e8);
  if (*(int *)&(this->super_LinearOperator).field_0xc != 0) {
    local_c8 = *(long *)(X + 0x10);
    lVar2 = 0;
    do {
      local_e8.sz.width = 0;
      local_e8.sz.height = 0;
      uStack_d0 = 0;
      local_e8.flags = 0;
      local_e8._4_4_ = 0;
      local_e8.obj = (void *)0x0;
      local_100.flags = -0x3efdfffa;
      local_100.sz.width = 1;
      local_100.sz.height = 4;
      local_100.obj = &local_e8;
      cv::noArray();
      cv::Mat::setTo(&local_98,&local_100);
      fillBasisFunctionForIndex(this,(Mat *)&local_98,(int)lVar2);
      local_e8.sz.width = 0;
      local_e8.sz.height = 0;
      local_e8.flags = 0x2010000;
      local_e8.obj = &local_98;
      cv::Mat::convertTo((_OutputArray *)&local_98,(int)&local_e8,
                         (double)*(float *)(local_c8 + lVar2 * 4),0.0);
      local_e8.sz.width = 0;
      local_e8.sz.height = 0;
      local_e8.flags = 0x1010000;
      local_100.sz.width = 0;
      local_100.sz.height = 0;
      local_100.flags = 0x1010000;
      local_c0.super__InputArray.sz.width = 0;
      local_c0.super__InputArray.sz.height = 0;
      local_c0.super__InputArray.flags = -0x3dff0000;
      local_100.obj = &local_98;
      local_e8.obj = AstarX;
      local_c0.super__InputArray.obj = AstarX;
      p_Var1 = (_InputArray *)cv::noArray();
      cv::add(&local_e8,&local_100,&local_c0,p_Var1,-1);
      lVar2 = lVar2 + 1;
    } while ((uint)lVar2 < *(uint *)&(this->super_LinearOperator).field_0xc);
  }
  cv::Mat::~Mat((Mat *)&local_98);
  return;
}

Assistant:

void lts2::LBDOperator::ApplyConjugate(cv::Mat const& X, cv::Mat& AstarX)
{
    // The output is an image (actually, a patch)
    AstarX.create(_patchSize, CV_32F);
    AstarX.setTo(cv::Scalar(0));

    // Stub to hold the current image basis function: we will write
    // each basis function into it
    cv::Mat basisImage(_patchSize, CV_32F, cv::Scalar(0));
    
    // Coordinate value
    float const* p_x = X.ptr<float>(0);
    
    // Sum over the basis functions
    for (int i = 0; i < _pairsInUse; ++i)
    {
        // Reset
        basisImage.setTo(cv::Scalar(0));
        
        // Add "nominal" basis function
        fillBasisFunctionForIndex(basisImage, i);
        
        // Apply the amplitude
        basisImage *= (*p_x);
        ++p_x;
        
        // Sum
        AstarX += basisImage;
    }
}